

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddCustomTargetCommand.h
# Opt level: O0

cmCommand * __thiscall cmAddCustomTargetCommand::Clone(cmAddCustomTargetCommand *this)

{
  cmCommand *this_00;
  cmAddCustomTargetCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmAddCustomTargetCommand((cmAddCustomTargetCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmAddCustomTargetCommand; }